

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLCellABecLap::define
          (MLCellABecLap *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory)

{
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *in_RCX;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_RDX;
  MLCellLinOp *in_RSI;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *in_RDI;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *in_R8;
  LPInfo *in_R9;
  int amrlev;
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar1;
  
  MLCellLinOp::define(in_RSI,in_RDX,
                      (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RCX,in_R8,
                      in_R9,(Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                             *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(in_RCX,(size_type)in_R8);
  for (iVar1 = 0;
      iVar1 < *(int *)((long)&in_RDI[2].
                              super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4); iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffb8 =
         Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
         ::operator[](in_RDI,(size_type)in_stack_ffffffffffffffb8);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_RDI,(size_type)in_stack_ffffffffffffffb8);
    std::
    vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              *)in_RCX,(size_type)in_R8);
  }
  return;
}

Assistant:

void
MLCellABecLap::define (const Vector<Geometry>& a_geom,
                       const Vector<BoxArray>& a_grids,
                       const Vector<DistributionMapping>& a_dmap,
                       const LPInfo& a_info,
                       const Vector<FabFactory<FArrayBox> const*>& a_factory)
{
    MLCellLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory);

    m_overset_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_overset_mask[amrlev].resize(m_num_mg_levels[amrlev]);
    }
}